

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborTag __thiscall QCborValue::tag(QCborValue *this,QCborTag defaultValue)

{
  long lVar1;
  
  if (((*(int *)(this + 0x10) == 0xc0 || 0xffff < *(int *)(this + 0x10)) &&
      (lVar1 = *(long *)(this + 8), lVar1 != 0)) && (*(long *)(lVar1 + 0x38) == 2)) {
    defaultValue = **(QCborTag **)(lVar1 + 0x30);
  }
  return defaultValue;
}

Assistant:

QCborTag QCborValue::tag(QCborTag defaultValue) const
{
    return isTag() && container && container->elements.size() == 2 ?
                QCborTag(container->elements.at(0).value) : defaultValue;
}